

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  byte bVar1;
  uint uVar2;
  int local_1c;
  int n;
  ImGuiTableColumn *column_local;
  
  if (((byte)column->field_0x64 >> 2 & 3) == 0) {
    __assert_fail("column->SortDirectionsAvailCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x9c4,
                  "ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *)");
  }
  if (column->SortOrder == -1) {
    column_local._4_4_ = TableGetColumnAvailSortDirection(column,0);
  }
  else {
    local_1c = 0;
    while( true ) {
      if (2 < local_1c) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                      ,0x9ca,
                      "ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *)"
                     );
      }
      bVar1 = column->field_0x64;
      uVar2 = TableGetColumnAvailSortDirection(column,local_1c);
      if ((bVar1 & 3) == uVar2) break;
      local_1c = local_1c + 1;
    }
    column_local._4_4_ =
         TableGetColumnAvailSortDirection
                   (column,(local_1c + 1) % (int)(uint)((byte)column->field_0x64 >> 2 & 3));
  }
  return column_local._4_4_;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}